

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimeline.cpp
# Opt level: O3

void __thiscall QTimeLine::stop(QTimeLine *this)

{
  QObjectData *pQVar1;
  QObject *sender;
  long in_FS_OFFSET;
  undefined4 local_30;
  undefined1 local_29;
  void *local_28;
  undefined4 *local_20;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  QBasicTimer::stop((QBasicTimer *)&pQVar1[1].metaObject);
  if (*(int *)((long)&pQVar1[2].children.d.d + 4) != 0) {
    sender = pQVar1->q_ptr;
    *(undefined4 *)((long)&pQVar1[2].children.d.d + 4) = 0;
    local_20 = &local_30;
    local_30 = 0;
    local_28 = (void *)0x0;
    local_18 = &local_29;
    QMetaObject::activate(sender,&staticMetaObject,2,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimeLine::stop()
{
    Q_D(QTimeLine);
    d->basicTimer.stop();
    d->setState(NotRunning);
}